

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Chapters::Atom::Parse(Atom *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long stop;
  longlong lVar1;
  long lVar2;
  long lVar3;
  longlong lVar4;
  longlong val;
  longlong size_1;
  longlong id;
  longlong local_50;
  unsigned_long_long local_48;
  long local_40;
  long local_38;
  
  stop = size + pos;
  if (0 < size) {
    local_50 = pos;
    do {
      lVar3 = ParseElementHeader(pReader,&local_50,stop,&local_38,&local_40);
      lVar2 = local_40;
      lVar1 = local_50;
      if (lVar3 < 0) {
        return lVar3;
      }
      if (local_40 != 0) {
        if (local_38 < 0x92) {
          if (local_38 == 0x80) {
            lVar3 = ParseDisplay(this,pReader,local_50,local_40);
LAB_00114da9:
            if (lVar3 < 0) {
              return lVar3;
            }
          }
          else if (local_38 == 0x91) {
            lVar4 = UnserializeUInt(pReader,local_50,local_40);
            if (lVar4 < 0) {
              return lVar4;
            }
            this->m_start_timecode = lVar4;
          }
        }
        else if (local_38 == 0x92) {
          lVar4 = UnserializeUInt(pReader,local_50,local_40);
          if (lVar4 < 0) {
            return lVar4;
          }
          this->m_stop_timecode = lVar4;
        }
        else {
          if (local_38 == 0x5654) {
            lVar3 = UnserializeString(pReader,local_50,local_40,&this->m_string_uid);
            goto LAB_00114da9;
          }
          if (local_38 == 0x73c4) {
            lVar3 = UnserializeInt(pReader,local_50,local_40,(longlong *)&local_48);
            if (lVar3 < 0) {
              return lVar3;
            }
            this->m_uid = local_48;
          }
        }
        local_50 = lVar1 + lVar2;
        if (stop < local_50) {
          return -2;
        }
      }
      pos = local_50;
    } while (local_50 < stop);
  }
  return (ulong)(pos == stop) * 2 + -2;
}

Assistant:

long Chapters::Atom::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // 0 length payload, skip.
      continue;

    if (id == libwebm::kMkvChapterDisplay) {
      status = ParseDisplay(pReader, pos, size);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterStringUID) {
      status = UnserializeString(pReader, pos, size, m_string_uid);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterUID) {
      long long val;
      status = UnserializeInt(pReader, pos, size, val);

      if (status < 0)  // error
        return status;

      m_uid = static_cast<unsigned long long>(val);
    } else if (id == libwebm::kMkvChapterTimeStart) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_start_timecode = val;
    } else if (id == libwebm::kMkvChapterTimeEnd) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_stop_timecode = val;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}